

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O1

string * __thiscall
cmCTestBuildHandler::GetMakeCommand_abi_cxx11_
          (string *__return_storage_ptr__,cmCTestBuildHandler *this)

{
  char *pcVar1;
  cmCTest *pcVar2;
  pointer pcVar3;
  ostream *poVar4;
  string *psVar5;
  string configType;
  string local_1e0;
  string local_1c0;
  undefined1 local_1a0 [112];
  ios_base local_130 [264];
  
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  pcVar1 = local_1a0 + 0x10;
  local_1a0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"MakeCommand","");
  cmCTest::GetCTestConfiguration(__return_storage_ptr__,pcVar2,(string *)local_1a0);
  if ((char *)local_1a0._0_8_ != pcVar1) {
    operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"MakeCommand:",0xc);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,(__return_storage_ptr__->_M_dataplus)._M_p,
                      __return_storage_ptr__->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
               ,0x110,local_1e0._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base(local_130);
  psVar5 = cmCTest::GetConfigType_abi_cxx11_((this->super_cmCTestGenericHandler).CTest);
  pcVar3 = (psVar5->_M_dataplus)._M_p;
  local_1a0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1a0,pcVar3,pcVar3 + psVar5->_M_string_length);
  if (local_1a0._8_8_ == 0) {
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1c0,"DefaultCTestConfigurationType","");
    cmCTest::GetCTestConfiguration(&local_1e0,pcVar2,&local_1c0);
    std::__cxx11::string::operator=((string *)local_1a0,(string *)&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_1a0._8_8_ == 0) {
    std::__cxx11::string::_M_replace((ulong)local_1a0,0,(char *)0x0,0x74f012);
  }
  cmsys::SystemTools::ReplaceString
            (__return_storage_ptr__,"${CTEST_CONFIGURATION_TYPE}",(char *)local_1a0._0_8_);
  if ((char *)local_1a0._0_8_ != pcVar1) {
    operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestBuildHandler::GetMakeCommand()
{
  std::string makeCommand = this->CTest->GetCTestConfiguration("MakeCommand");
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "MakeCommand:" << makeCommand << "\n", this->Quiet);

  std::string configType = this->CTest->GetConfigType();
  if (configType.empty()) {
    configType =
      this->CTest->GetCTestConfiguration("DefaultCTestConfigurationType");
  }
  if (configType.empty()) {
    configType = "Release";
  }

  cmSystemTools::ReplaceString(makeCommand, "${CTEST_CONFIGURATION_TYPE}",
                               configType.c_str());

  return makeCommand;
}